

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall ShadingPass::ShadingPass(ShadingPass *this,uint width,uint height)

{
  uint uVar1;
  uint attachments [1];
  undefined4 local_104;
  Shader *local_100;
  Shader *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"shaders/final.vert","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"shaders/draw.frag","");
  local_f8 = &this->draw_program;
  Shader::Shader(local_f8,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shaders/final.vert","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"shaders/final.frag","");
  local_100 = &this->shading_program;
  Shader::Shader(local_100,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"shaders/skybox.vert","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"shaders/skybox.frag","");
  Shader::Shader(&this->skybox_program,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_104 = 0x8ce0;
  (*gl3wProcs.ptr[0xac])(1,&this->fbo);
  (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
  uVar1 = create_texture(width,height,0x8815,0x1907);
  this->shading_tex = uVar1;
  (*gl3wProcs.ptr[0xa7])(0x8d40,0x8ce0,0xde1,(ulong)uVar1,0);
  (*gl3wProcs.ptr[0x88])(1,&local_104);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  uVar1 = createSkyboxVAO();
  this->cube_vao = uVar1;
  this->ambient_intensity = 1.0;
  this->shadow_bias = 1e-08;
  this->use_pcf = true;
  this->frame_num = 0;
  this->pcf_radius = 3.0;
  this->skybox_choice = 0;
  return;
}

Assistant:

ShadingPass::ShadingPass(unsigned int width, unsigned int height)
    : draw_program("shaders/final.vert", "shaders/draw.frag")
    , shading_program("shaders/final.vert", "shaders/final.frag")
    , skybox_program("shaders/skybox.vert", "shaders/skybox.frag")
{
    unsigned int attachments[1] = { GL_COLOR_ATTACHMENT0 };
    glGenFramebuffers(1, &fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    shading_tex = create_texture(width, height, GL_RGB32F, GL_RGB);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, shading_tex, 0);
    glDrawBuffers(1, attachments);
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    cube_vao = createSkyboxVAO();

    ambient_intensity = 1.f;
    shadow_bias = 1e-8;
    use_pcf = true;
    pcf_radius = 3;

    frame_num = 0;

    skybox_choice = 0;
}